

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stringBuffer.cc
# Opt level: O0

void __thiscall Vector::storeValue(Vector *this,long v,unsigned_long l)

{
  void *pvVar1;
  ulong in_RDX;
  undefined8 in_RSI;
  long *in_RDI;
  long addThis;
  long local_20;
  
  if ((ulong)in_RDI[2] <= in_RDX) {
    local_20 = (in_RDX - in_RDI[2]) + 1;
    if (local_20 < vDefaultBoost) {
      local_20 = vDefaultBoost;
    }
    in_RDI[2] = local_20 + in_RDI[2];
    pvVar1 = realloc((void *)*in_RDI,in_RDI[2] << 3);
    *in_RDI = (long)pvVar1;
    in_RDI[1] = in_RDX + 1;
  }
  *(undefined8 *)(*in_RDI + in_RDX * 8) = in_RSI;
  return;
}

Assistant:

void Vector::storeValue(const long v, const unsigned long l) {
  long addThis;
  if (l >= vaLength) {
    addThis = l - vaLength + 1;
    if (Vector::vDefaultBoost > addThis)
      addThis = Vector::vDefaultBoost;
    vaLength += addThis;
    vData = (long *)realloc(vData, sizeof(long) * vaLength);
    vLength = l + 1;
  }
  vData[l] = v;
}